

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.hpp
# Opt level: O3

string * generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::FilterFederate::query[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__1>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    *__return_storage_ptr__,undefined8 *data)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  uint uVar3;
  string *extraout_RAX;
  string *psVar4;
  ulong uVar5;
  uint __len;
  uint *puVar6;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string_t local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  uint *local_48;
  data local_40;
  
  local_50 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  puVar6 = (uint *)*data;
  local_48 = (uint *)data[1];
  if (puVar6 != local_48) {
    do {
      uVar1 = *puVar6;
      __val = -uVar1;
      if (0 < (int)uVar1) {
        __val = uVar1;
      }
      __len = 1;
      if (9 < __val) {
        uVar5 = (ulong)__val;
        uVar2 = 4;
        do {
          __len = uVar2;
          uVar3 = (uint)uVar5;
          if (uVar3 < 100) {
            __len = __len - 2;
            goto LAB_00362de5;
          }
          if (uVar3 < 1000) {
            __len = __len - 1;
            goto LAB_00362de5;
          }
          if (uVar3 < 10000) goto LAB_00362de5;
          uVar5 = uVar5 / 10000;
          uVar2 = __len + 4;
        } while (99999 < uVar3);
        __len = __len + 1;
      }
LAB_00362de5:
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct(&local_90,(ulong)(__len + -((int)uVar1 >> 0x1f)),'-');
      CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_90._M_dataplus._M_p + (uint)-((int)uVar1 >> 0x1f),__len,__val);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_40,&local_90);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::dump(&local_70,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_40,-1,' ',true,hex);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_40);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append(__return_storage_ptr__,local_70._M_dataplus._M_p,local_70._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(__return_storage_ptr__,',');
      puVar6 = puVar6 + 1;
    } while (puVar6 != local_48);
  }
  psVar4 = (string *)__return_storage_ptr__->_M_string_length;
  if (psVar4 < (string *)0x2) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,']');
    psVar4 = extraout_RAX;
  }
  else {
    ((__return_storage_ptr__->_M_dataplus)._M_p + -1)[(long)psVar4] = ']';
  }
  return psVar4;
}

Assistant:

std::string generateStringVector(const X& data, Proc generator)
{
    static_assert(std::is_convertible<decltype(generator(*(data.begin()))), std::string>::value,
                  "generator output must be convertible to std::string");
    std::string ret{"["};
    for (auto& ele : data) {
        ret.append(helics::generateJsonQuotedString(generator(ele)));
        ret.push_back(',');
    }
    if (ret.size() > 1) {
        ret.back() = ']';
    } else {
        ret.push_back(']');
    }
    return ret;
}